

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *directory,FilePath *base_name,int number,char *extension)

{
  int in_ECX;
  FilePath *in_RDX;
  FilePath *in_RDI;
  string file;
  char *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  string local_138 [32];
  string local_118 [8];
  FilePath *in_stack_fffffffffffffef0;
  FilePath *in_stack_fffffffffffffef8;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [48];
  string local_88 [32];
  string local_68 [32];
  string local_48 [44];
  int local_1c;
  FilePath *local_18;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_48);
  if (local_1c == 0) {
    in_stack_fffffffffffffe70 = string_abi_cxx11_(local_18);
    std::operator+(in_stack_fffffffffffffe88,(char *)in_RDI);
    std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::__cxx11::string::operator=(local_48,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  else {
    in_stack_fffffffffffffe68 = string_abi_cxx11_(local_18);
    std::operator+(in_stack_fffffffffffffe88,(char *)in_RDI);
    StreamableToString<int>((int *)in_stack_fffffffffffffe88);
    std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    std::__cxx11::string::operator=(local_48,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_118);
  }
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe88,local_48);
  FilePath((FilePath *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  ConcatPaths(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  ~FilePath((FilePath *)0x1824c9);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name, int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file =
        base_name.string() + "_" + StreamableToString(number) + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}